

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O0

void san_unguard_pages_impl
               (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,emap_t *emap,_Bool left,_Bool right,
               _Bool remap)

{
  size_t size_00;
  void *in_RCX;
  edata_t *in_RDX;
  byte in_R8B;
  uint in_R9D;
  byte in_stack_00000008;
  void *addr;
  void *guard2;
  void *guard1;
  size_t size_with_guards;
  size_t size;
  undefined4 in_stack_00000130;
  szind_t in_stack_00000134;
  edata_t *in_stack_00000138;
  emap_t *in_stack_00000140;
  tsdn_t *in_stack_00000148;
  size_t local_70;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 uVar1;
  undefined1 right_00;
  undefined1 left_00;
  edata_t *ehooks_00;
  tsdn_t *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  edata_t *in_stack_ffffffffffffffc0;
  
  uVar1 = (undefined2)in_R9D;
  right_00 = (undefined1)(in_R9D >> 0x10);
  left_00 = (undefined1)(in_R9D >> 0x18);
  ehooks_00 = in_RDX;
  if ((in_stack_00000008 & 1) != 0) {
    duckdb_je_emap_deregister_boundary
              ((tsdn_t *)in_stack_00000140,(emap_t *)in_stack_00000138,
               (edata_t *)CONCAT44(in_stack_00000134,in_stack_00000130));
  }
  size_00 = edata_size_get(in_RDX);
  if (((in_R8B & 1) == 0) || ((in_R9D & 1) == 0)) {
    local_70 = san_one_side_guarded_sz(size_00);
  }
  else {
    local_70 = san_two_side_guarded_sz(size_00);
  }
  san_find_unguarded_addr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(void **)in_stack_ffffffffffffffb0,
             (void **)ehooks_00,(size_t)in_RCX,(_Bool)left_00,(_Bool)right_00);
  ehooks_unguard(in_stack_ffffffffffffffb0,(ehooks_t *)ehooks_00,in_RCX,
                 (void *)CONCAT17(left_00,CONCAT16(right_00,CONCAT24(uVar1,in_stack_ffffffffffffff98
                                                                    ))));
  edata_size_set(in_RDX,local_70);
  edata_addr_set(in_RDX,in_stack_ffffffffffffffb0);
  edata_guarded_set(in_RDX,false);
  if ((in_stack_00000008 & 1) != 0) {
    duckdb_je_emap_register_boundary
              (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000134,
               in_stack_00000130._3_1_);
  }
  return;
}

Assistant:

static void
san_unguard_pages_impl(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    emap_t *emap, bool left, bool right, bool remap) {
	assert(left || right);
	/* Remove the inner boundary which no longer exists. */
	if (remap) {
		assert(edata_state_get(edata) == extent_state_active);
		emap_deregister_boundary(tsdn, emap, edata);
	} else {
		assert(edata_state_get(edata) == extent_state_retained);
	}

	size_t size = edata_size_get(edata);
	size_t size_with_guards = (left && right)
	    ? san_two_side_guarded_sz(size)
	    : san_one_side_guarded_sz(size);

	void *guard1, *guard2, *addr;
	san_find_unguarded_addr(edata, &guard1, &guard2, &addr, size, left,
	    right);

	ehooks_unguard(tsdn, ehooks, (void *)guard1, (void *)guard2);

	/* Update the true addr and usable size of the edata. */
	edata_size_set(edata, size_with_guards);
	edata_addr_set(edata, (void *)addr);
	edata_guarded_set(edata, false);

	/*
	 * Then re-register the outer boundary including the guards, if
	 * requested.
	 */
	if (remap) {
		emap_register_boundary(tsdn, emap, edata, SC_NSIZES,
		    /* slab */ false);
	}
}